

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall duckdb_re2::ByteMapBuilder::Merge(ByteMapBuilder *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  pointer ppVar4;
  int iVar5;
  int iVar6;
  pointer ppVar7;
  
  ppVar7 = (this->ranges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (ppVar7 == (this->ranges_).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      ppVar4 = (this->colormap_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->colormap_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish != ppVar4) {
        (this->colormap_).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = ppVar4;
      }
      ppVar4 = (this->ranges_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (ppVar7 != ppVar4) {
        (this->ranges_).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = ppVar4;
      }
      return;
    }
    iVar6 = ppVar7->first;
    iVar2 = ppVar7->second;
    if (0 < iVar6) {
      uVar1 = iVar6 - 1;
      uVar3 = (this->splits_).words_[uVar1 >> 6];
      if ((uVar3 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        (this->splits_).words_[uVar1 >> 6] = uVar3 | 1L << ((byte)uVar1 & 0x3f);
        iVar5 = Bitmap256::FindNextSetBit(&this->splits_,iVar6);
        this->colors_[uVar1] = this->colors_[iVar5];
      }
    }
    uVar3 = (this->splits_).words_[iVar2 / 0x40];
    if ((uVar3 >> ((long)iVar2 % 0x40 & 0x3fU) & 1) == 0) {
      (this->splits_).words_[iVar2 / 0x40] = uVar3 | 1L << ((byte)((long)iVar2 % 0x40) & 0x3f);
      iVar5 = Bitmap256::FindNextSetBit(&this->splits_,iVar2 + 1);
      this->colors_[iVar2] = this->colors_[iVar5];
    }
    do {
      if (0xff < iVar6) break;
      iVar5 = Bitmap256::FindNextSetBit(&this->splits_,iVar6);
      iVar6 = Recolor(this,this->colors_[iVar5]);
      this->colors_[iVar5] = iVar6;
      iVar6 = iVar5 + 1;
    } while (iVar5 != iVar2);
    ppVar7 = ppVar7 + 1;
  } while( true );
}

Assistant:

void ByteMapBuilder::Merge() {
  for (std::vector<std::pair<int, int>>::const_iterator it = ranges_.begin();
       it != ranges_.end();
       ++it) {
    int lo = it->first-1;
    int hi = it->second;

    if (0 <= lo && !splits_.Test(lo)) {
      splits_.Set(lo);
      int next = splits_.FindNextSetBit(lo+1);
      colors_[lo] = colors_[next];
    }
    if (!splits_.Test(hi)) {
      splits_.Set(hi);
      int next = splits_.FindNextSetBit(hi+1);
      colors_[hi] = colors_[next];
    }

    int c = lo+1;
    while (c < 256) {
      int next = splits_.FindNextSetBit(c);
      colors_[next] = Recolor(colors_[next]);
      if (next == hi)
        break;
      c = next+1;
    }
  }
  colormap_.clear();
  ranges_.clear();
}